

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int quick_select_int(int *arr,int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int t_6;
  int t_5;
  int t_4;
  int t_3;
  int t_2;
  int t_1;
  int t;
  int hh;
  int ll;
  int middle;
  int median;
  int high;
  int low;
  int n_local;
  int *arr_local;
  
  median = 0;
  middle = n + -1;
  iVar2 = middle / 2;
  while( true ) {
    if (middle <= median) {
      return arr[iVar2];
    }
    if (middle == median + 1) break;
    iVar3 = (median + middle) / 2;
    if (arr[middle] < arr[iVar3]) {
      iVar1 = arr[iVar3];
      arr[iVar3] = arr[middle];
      arr[middle] = iVar1;
    }
    if (arr[middle] < arr[median]) {
      iVar1 = arr[median];
      arr[median] = arr[middle];
      arr[middle] = iVar1;
    }
    if (arr[median] < arr[iVar3]) {
      iVar1 = arr[iVar3];
      arr[iVar3] = arr[median];
      arr[median] = iVar1;
    }
    iVar1 = arr[iVar3];
    arr[iVar3] = arr[median + 1];
    arr[median + 1] = iVar1;
    t = median + 1;
    t_1 = middle;
    while( true ) {
      do {
        t = t + 1;
        iVar3 = t_1;
      } while (arr[t] < arr[median]);
      do {
        t_1 = iVar3;
        iVar3 = t_1 + -1;
      } while (arr[median] < arr[iVar3]);
      if (iVar3 < t) break;
      iVar1 = arr[t];
      arr[t] = arr[iVar3];
      arr[iVar3] = iVar1;
      t_1 = iVar3;
    }
    iVar1 = arr[median];
    arr[median] = arr[iVar3];
    arr[iVar3] = iVar1;
    if (iVar3 <= iVar2) {
      median = t;
    }
    if (iVar2 <= iVar3) {
      middle = t_1 + -2;
    }
  }
  if (arr[middle] < arr[median]) {
    iVar3 = arr[median];
    arr[median] = arr[middle];
    arr[middle] = iVar3;
  }
  return arr[iVar2];
}

Assistant:

static int quick_select_int(int arr[], int n) 
{
    int low, high ;
    int median;
    int middle, ll, hh;

    low = 0 ; high = n-1 ; median = (low + high) / 2;
    for (;;) {
        if (high <= low) /* One element only */
            return arr[median] ;

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]) ;
            return arr[median] ;
        }

    /* Find median of low, middle and high items; swap into position low */
    middle = (low + high) / 2;
    if (arr[middle] > arr[high])    ELEM_SWAP(arr[middle], arr[high]) ;
    if (arr[low] > arr[high])       ELEM_SWAP(arr[low], arr[high]) ;
    if (arr[middle] > arr[low])     ELEM_SWAP(arr[middle], arr[low]) ;

    /* Swap low item (now in position middle) into position (low+1) */
    ELEM_SWAP(arr[middle], arr[low+1]) ;

    /* Nibble from each end towards middle, swapping items when stuck */
    ll = low + 1;
    hh = high;
    for (;;) {
        do ll++; while (arr[low] > arr[ll]) ;
        do hh--; while (arr[hh]  > arr[low]) ;

        if (hh < ll)
        break;

        ELEM_SWAP(arr[ll], arr[hh]) ;
    }

    /* Swap middle item (in position low) back into correct position */
    ELEM_SWAP(arr[low], arr[hh]) ;

    /* Re-set active partition */
    if (hh <= median)
        low = ll;
        if (hh >= median)
        high = hh - 1;
    }
}